

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syncprod.cc
# Opt level: O3

outgoing_edges_range_t * __thiscall
tchecker::syncprod::syncprod_t::outgoing_edges
          (outgoing_edges_range_t *__return_storage_ptr__,syncprod_t *this,const_state_sptr_t *s)

{
  system_t *system;
  overflow_error *this_00;
  loc_array_t lVar1;
  const_vloc_sptr_t local_18;
  
  if (s->_t == (make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL> *)0x0) {
    __assert_fail("_t != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                  ,0x1db,
                  "T *tchecker::intrusive_shared_ptr_t<const tchecker::make_shared_t<tchecker::syncprod::state_t>>::operator->() const [T = const tchecker::make_shared_t<tchecker::syncprod::state_t>]"
                 );
  }
  system = (this->_system).
           super___shared_ptr<const_tchecker::syncprod::system_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_18._t = (s->_t->super_state_t)._vloc._t;
  if (local_18._t != (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0) {
    lVar1 = (loc_array_t)((long)local_18._t[-1].super_vloc_t.super_loc_array_t + 1);
    local_18._t[-1].super_vloc_t.super_loc_array_t = lVar1;
    if (lVar1 == (loc_array_t)0xfffffffffffffffe) {
      this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error(this_00,"reference counter overflow");
      __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
    }
  }
  syncprod::outgoing_edges(__return_storage_ptr__,system,&local_18);
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
  ~intrusive_shared_ptr_t(&local_18);
  return __return_storage_ptr__;
}

Assistant:

void syncprod_t::initial(std::vector<sst_t> & v, tchecker::state_status_t mask) { tchecker::ts::initial(*this, v, mask); }